

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O0

uint8_t * __thiscall
google::protobuf::UnknownField::InternalSerializeLengthDelimitedNoTag
          (UnknownField *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  Nullable<const_char_*> this_00;
  Type *v1;
  Type *v2;
  char *failure_msg;
  LogMessage *pLVar1;
  size_type sVar2;
  const_pointer data_00;
  uint8_t *puVar3;
  undefined1 auVar4 [16];
  undefined1 local_68 [8];
  string_view data;
  LogMessage local_48;
  Voidify local_31;
  Type local_30 [2];
  Nullable<const_char_*> local_28;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  UnknownField *this_local;
  
  local_30[1] = 3;
  absl_log_internal_check_op_result = (Nullable<const_char_*>)stream;
  stream_local = (EpsCopyOutputStream *)target;
  target_local = (uint8_t *)this;
  v1 = absl::lts_20250127::log_internal::GetReferenceableValue<google::protobuf::UnknownField::Type>
                 (local_30 + 1);
  local_30[0] = type(this);
  v2 = absl::lts_20250127::log_internal::GetReferenceableValue<google::protobuf::UnknownField::Type>
                 (local_30);
  local_28 = absl::lts_20250127::log_internal::
             Check_EQImpl<google::protobuf::UnknownField::Type,google::protobuf::UnknownField::Type>
                       (v1,v2,"TYPE_LENGTH_DELIMITED == type()");
  if (local_28 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_28);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_48,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/unknown_field_set.cc"
               ,0x11b,failure_msg);
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_48);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_31,pLVar1);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_48);
  }
  auVar4 = std::__cxx11::string::operator_cast_to_basic_string_view
                     ((string *)(this->data_).string_value);
  data._M_len = auVar4._8_8_;
  local_68 = auVar4._0_8_;
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_68);
  stream_local = (EpsCopyOutputStream *)
                 io::CodedOutputStream::WriteVarint32ToArray
                           ((uint32_t)sVar2,(uint8_t *)stream_local);
  this_00 = absl_log_internal_check_op_result;
  data_00 = std::basic_string_view<char,_std::char_traits<char>_>::data
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_68);
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_68);
  puVar3 = io::EpsCopyOutputStream::WriteRaw
                     ((EpsCopyOutputStream *)this_00,data_00,(int)sVar2,(uint8_t *)stream_local);
  return puVar3;
}

Assistant:

uint8_t* UnknownField::InternalSerializeLengthDelimitedNoTag(
    uint8_t* target, io::EpsCopyOutputStream* stream) const {
  ABSL_DCHECK_EQ(TYPE_LENGTH_DELIMITED, type());
  const absl::string_view data = *data_.string_value;
  target = io::CodedOutputStream::WriteVarint32ToArray(data.size(), target);
  target = stream->WriteRaw(data.data(), data.size(), target);
  return target;
}